

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::file_error_alert::~file_error_alert(file_error_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004ebb90;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT file_error_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT file_error_alert(aux::stack_allocator& alloc, error_code const& ec
			, string_view file, operation_t op, torrent_handle const& h);

		TORRENT_DEFINE_ALERT_PRIO(file_error_alert, 43, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::status
			| alert_category::error
			| alert_category::storage;
		std::string message() const override;

		// the error code describing the error.
		error_code const error;

		// indicates which underlying operation caused the error
		operation_t op;

		// the file that experienced the error
		char const* filename() const;

	private:
		aux::allocation_slot m_file_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED char const* operation;
		// the path to the file that was accessed when the error occurred.
		TORRENT_DEPRECATED std::string file;
		TORRENT_DEPRECATED std::string msg;
#endif
	}